

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleanimation_p.h
# Opt level: O1

void __thiscall QBlendStyleAnimation::~QBlendStyleAnimation(QBlendStyleAnimation *this)

{
  *(undefined ***)this = &PTR_metaObject_007fb268;
  QImage::~QImage((QImage *)(this + 0x58));
  QImage::~QImage((QImage *)(this + 0x40));
  QImage::~QImage((QImage *)(this + 0x28));
  QAbstractAnimation::~QAbstractAnimation((QAbstractAnimation *)this);
  operator_delete(this,0x70);
  return;
}

Assistant:

class Q_WIDGETS_EXPORT QBlendStyleAnimation : public QStyleAnimation
{
    Q_OBJECT

public:
    enum Type { Transition, Pulse };

    QBlendStyleAnimation(Type type, QObject *target);

    QImage startImage() const;
    void setStartImage(const QImage& image);

    QImage endImage() const;
    void setEndImage(const QImage& image);

    QImage currentImage() const;

protected:
    virtual void updateCurrentTime(int time) override;

private:
    Type _type;
    QImage _start;
    QImage _end;
    QImage _current;
}